

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O3

uint8 * rw::xbox::rasterLock(Raster *raster,int32 level,int32 lockMode)

{
  long lVar1;
  undefined8 uVar2;
  uint8 *puVar3;
  long lVar4;
  
  if ((raster->privateFlags & 6U) == 0) {
    lVar4 = (long)nativeRasterOffset;
    lVar1 = *(long *)((long)&raster->platform + lVar4);
    puVar3 = *(uint8 **)(lVar1 + 0x18 + (long)level * 0x18);
    raster->pixels = puVar3;
    uVar2 = *(undefined8 *)(lVar1 + 8 + (long)level * 0x18);
    raster->width = (int)uVar2;
    raster->height = (int)((ulong)uVar2 >> 0x20);
    raster->stride = (int)uVar2 * *(int *)((long)&raster->width + lVar4);
    if ((lockMode & 3U) != 0) {
      raster->privateFlags =
           raster->privateFlags |
           (uint)((byte)(((byte)lockMode & 2) << 5 | (byte)lockMode << 7) >> 5);
      return puVar3;
    }
  }
  else {
    puVar3 = (uint8 *)0x0;
  }
  return puVar3;
}

Assistant:

uint8*
rasterLock(Raster *raster, int32 level, int32 lockMode)
{
	XboxRaster *natras = GETXBOXRASTEREXT(raster);

	// check if already locked
	if(raster->privateFlags & (Raster::PRIVATELOCK_READ|Raster::PRIVATELOCK_WRITE))
		return nil;

	RasterLevels *levels = (RasterLevels*)natras->texture;
	raster->pixels = levels->levels[level].data;
	raster->width = levels->levels[level].width;
	raster->height = levels->levels[level].height;
	raster->stride = raster->width*natras->bpp;

	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE;

	return raster->pixels;
}